

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O3

string * __thiscall
t_st_generator::map_writer
          (string *__return_storage_ptr__,t_st_generator *this,t_map *tmap,string *fname)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  t_type *ptVar3;
  ostream *poVar4;
  char *pcVar5;
  string val;
  string key;
  ostringstream out;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  temp_name_abi_cxx11_(&local_228,this);
  temp_name_abi_cxx11_(&local_248,this);
  pcVar5 = "[oprot writeMapBegin: (TMap new keyType: ";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"[oprot writeMapBegin: (TMap new keyType: ",0x29);
  type_to_enum_abi_cxx11_(&local_2a8,(t_st_generator *)pcVar5,tmap->key_type_);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
  pcVar5 = "; valueType: ";
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"; valueType: ",0xd);
  type_to_enum_abi_cxx11_(&local_288,(t_st_generator *)pcVar5,tmap->val_type_);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_288._M_dataplus._M_p,local_288._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"; size: ",8);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(fname->_M_dataplus)._M_p,fname->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," size).",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  paVar2 = &local_2a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_2a8,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(fname->_M_dataplus)._M_p,fname->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," keysAndValuesDo: [:",0x14);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_228._M_dataplus._M_p,local_228._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," :",2);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_248._M_dataplus._M_p,local_248._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," |",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_2a8,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
  ptVar3 = tmap->key_type_;
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_228._M_dataplus._M_p,
             local_228._M_dataplus._M_p + local_228._M_string_length);
  write_val(&local_288,this,ptVar3,&local_268);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_288._M_dataplus._M_p,local_288._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,".",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_1c8,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  ptVar3 = tmap->val_type_;
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,local_248._M_dataplus._M_p,
             local_248._M_dataplus._M_p + local_248._M_string_length);
  write_val(&local_1e8,this,ptVar3,&local_208);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"].",2);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_2a8,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"oprot writeMapEnd] value",0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

string t_st_generator::map_writer(t_map* tmap, string fname) {
  std::ostringstream out;
  string key = temp_name();
  string val = temp_name();

  out << "[oprot writeMapBegin: (TMap new keyType: " << type_to_enum(tmap->get_key_type())
      << "; valueType: " << type_to_enum(tmap->get_val_type()) << "; size: " << fname << " size)."
      << endl;
  indent_up();

  out << indent() << fname << " keysAndValuesDo: [:" << key << " :" << val << " |" << endl;
  indent_up();

  out << indent() << write_val(tmap->get_key_type(), key) << "." << endl << indent()
      << write_val(tmap->get_val_type(), val);
  indent_down();

  out << "]." << endl << indent() << "oprot writeMapEnd] value";
  indent_down();

  return out.str();
}